

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLeft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *vec,
           number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *rhs)

{
  cpp_dec_float<100U,_int,_void> cStack_68;
  
  if ((this->l).updateType != 0) {
    solveUleft(this,vec,rhs);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&cStack_68,0.0,(type *)0x0);
    solveLleftForest(this,vec,(int *)0x0,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&cStack_68);
    solveLleft(this,vec);
    return;
  }
  solveUpdateLeft(this,rhs);
  solveUleft(this,vec,rhs);
  solveLleft(this,vec);
  return;
}

Assistant:

void CLUFactor<R>::solveLeft(R* vec, R* rhs)
{

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      solveUpdateLeft(rhs);
      solveUleft(vec, rhs);
      solveLleft(vec);
   }
   else
   {
      solveUleft(vec, rhs);
      //@todo is 0.0 the right value for eps here ?
      solveLleftForest(vec, nullptr, 0.0);
      solveLleft(vec);
   }
}